

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord2.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord2::Encode
          (RectangularVolumeRecord2 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>
            (stream,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>
            (stream,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.m_ui16Length);
  KDataStream::Write(stream,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                            m_ui8Index);
  KDataStream::Write(stream,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                            m_ui8Padding);
  (*(this->super_RectangularVolumeRecord1).m_CornerLocation.super_DataTypeBase._vptr_DataTypeBase[5]
  )(&(this->super_RectangularVolumeRecord1).m_CornerLocation,stream);
  (*(this->super_RectangularVolumeRecord1).m_RecLength.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_RectangularVolumeRecord1).m_RecLength,stream);
  (*(this->m_DDT).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DDT,stream);
  (*(this->super_RectangularVolumeRecord1).m_Ori.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_RectangularVolumeRecord1).m_Ori,stream);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  KDataStream::Write<float>(stream,(float)this->m_f32Padding);
  return;
}

Assistant:

void RectangularVolumeRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CornerLocation
           << KDIS_STREAM m_RecLength
           << KDIS_STREAM m_DDT
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_f32Padding;
}